

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall NaStateSpaceModel::Save(NaStateSpaceModel *this,NaDataStream *ds)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  NaReal *pNVar4;
  NaMatrix *__s;
  NaDataStream *in_RSI;
  long in_RDI;
  NaReal fX0i;
  char szComment [100];
  char *szBuf;
  uint j;
  uint i;
  char *in_stack_fffffffffffffec8;
  NaMatrix *in_stack_fffffffffffffed0;
  NaReal local_128;
  char local_88 [40];
  uint local_18;
  uint local_14;
  
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  NaDataStream::PutF(in_RSI,"Dimensions N M K","%u %u %u",(ulong)*(uint *)(in_RDI + 0x40),
                     (ulong)*(uint *)(in_RDI + 0x44),(ulong)*(uint *)(in_RDI + 0x48));
  sprintf(local_88," Matrix A(%u,%u), %u numbers:",(ulong)*(uint *)(in_RDI + 0x40),
          (ulong)*(uint *)(in_RDI + 0x40),
          (ulong)(uint)(*(int *)(in_RDI + 0x40) * *(int *)(in_RDI + 0x40)));
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x50));
  pcVar2 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  local_14 = 0;
  while( true ) {
    uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x50));
    if (uVar1 <= local_14) break;
    *pcVar2 = '\0';
    local_18 = 0;
    while( true ) {
      uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x50));
      if (uVar1 <= local_18) break;
      sVar3 = strlen(pcVar2);
      pNVar4 = NaMatrix::operator[]
                         (in_stack_fffffffffffffed0,(uint)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                         );
      sprintf(pcVar2 + sVar3," %g",pNVar4[local_18]);
      local_18 = local_18 + 1;
    }
    NaDataStream::PutF(in_RSI,(char *)0x0,"%s",pcVar2);
    local_14 = local_14 + 1;
  }
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  sprintf(local_88," Matrix B(%u,%u), %u numbers:",(ulong)*(uint *)(in_RDI + 0x40),
          (ulong)*(uint *)(in_RDI + 0x48),
          (ulong)(uint)(*(int *)(in_RDI + 0x40) * *(int *)(in_RDI + 0x48)));
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x68));
  pcVar2 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  local_14 = 0;
  while( true ) {
    uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x68));
    if (uVar1 <= local_14) break;
    *pcVar2 = '\0';
    local_18 = 0;
    while( true ) {
      uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x68));
      if (uVar1 <= local_18) break;
      sVar3 = strlen(pcVar2);
      pNVar4 = NaMatrix::operator[]
                         (in_stack_fffffffffffffed0,(uint)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                         );
      sprintf(pcVar2 + sVar3," %g",pNVar4[local_18]);
      local_18 = local_18 + 1;
    }
    NaDataStream::PutF(in_RSI,(char *)0x0,"%s",pcVar2);
    local_14 = local_14 + 1;
  }
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  sprintf(local_88," Matrix C(%u,%u), %u numbers:",(ulong)*(uint *)(in_RDI + 0x44),
          (ulong)*(uint *)(in_RDI + 0x40),
          (ulong)(uint)(*(int *)(in_RDI + 0x44) * *(int *)(in_RDI + 0x40)));
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x80));
  pcVar2 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  local_14 = 0;
  while( true ) {
    uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x80));
    if (uVar1 <= local_14) break;
    *pcVar2 = '\0';
    local_18 = 0;
    while( true ) {
      uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x80));
      if (uVar1 <= local_18) break;
      sVar3 = strlen(pcVar2);
      pNVar4 = NaMatrix::operator[]
                         (in_stack_fffffffffffffed0,(uint)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                         );
      sprintf(pcVar2 + sVar3," %g",pNVar4[local_18]);
      local_18 = local_18 + 1;
    }
    NaDataStream::PutF(in_RSI,(char *)0x0,"%s",pcVar2);
    local_14 = local_14 + 1;
  }
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  sprintf(local_88," Matrix D(%u,%u), %u numbers:",(ulong)*(uint *)(in_RDI + 0x44),
          (ulong)*(uint *)(in_RDI + 0x48),
          (ulong)(uint)(*(int *)(in_RDI + 0x44) * *(int *)(in_RDI + 0x48)));
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x98));
  pcVar2 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  local_14 = 0;
  while( true ) {
    uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x98));
    if (uVar1 <= local_14) break;
    *pcVar2 = '\0';
    local_18 = 0;
    while( true ) {
      uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x98));
      if (uVar1 <= local_18) break;
      sVar3 = strlen(pcVar2);
      pNVar4 = NaMatrix::operator[]
                         (in_stack_fffffffffffffed0,(uint)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                         );
      sprintf(pcVar2 + sVar3," %g",pNVar4[local_18]);
      local_18 = local_18 + 1;
    }
    NaDataStream::PutF(in_RSI,(char *)0x0,"%s",pcVar2);
    local_14 = local_14 + 1;
  }
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  NaDataStream::PutComment((NaDataStream *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  __s = (NaMatrix *)operator_new__((ulong)(uint)(*(int *)(in_RDI + 0x40) * 0x14));
  *(char *)&__s->_vptr_NaMatrix = '\0';
  for (local_14 = 0; local_14 < *(uint *)(in_RDI + 0x40); local_14 = local_14 + 1) {
    uVar1 = NaVector::dim((NaVector *)(in_RDI + 200));
    if (local_14 < uVar1) {
      pNVar4 = NaVector::operator[]
                         ((NaVector *)in_stack_fffffffffffffed0,
                          (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      local_128 = *pNVar4;
    }
    else {
      local_128 = 0.0;
    }
    in_stack_fffffffffffffed0 = __s;
    sVar3 = strlen((char *)__s);
    sprintf((char *)((long)&in_stack_fffffffffffffed0->_vptr_NaMatrix + sVar3)," %g",local_128);
  }
  NaDataStream::PutF(in_RSI,(char *)0x0,"%s",__s);
  if (__s != (NaMatrix *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void
NaStateSpaceModel::Save (NaDataStream& ds)
{
    unsigned     i, j;
    char    *szBuf, szComment[100];

    ds.PutComment(" State space discrete time model:");
    ds.PutComment("   x(t+1) = A*x(t) + B*u(t)");
    ds.PutComment("   y(t)   = C*x(t) + D*u(t)");
    ds.PutComment(" Matrices: A(N,N), B(N,K), C(M,N), D(M,K)");
    ds.PutComment("   N - state vector, M - outputs, K - inputs");
    ds.PutF("Dimensions N M K", "%u %u %u", n, m, k);

    sprintf(szComment, " Matrix A(%u,%u), %u numbers:", n, n, n*n);
    ds.PutComment(szComment);
    szBuf = new char[20*A.dim_cols()];
    for(i = 0; i < A.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < A.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", A[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix B(%u,%u), %u numbers:", n, k, n*k);
    ds.PutComment(szComment);
    szBuf = new char[20*B.dim_cols()];
    for(i = 0; i < B.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < B.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", B[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix C(%u,%u), %u numbers:", m, n, m*n);
    ds.PutComment(szComment);
    szBuf = new char[20*C.dim_cols()];
    for(i = 0; i < C.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < C.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", C[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix D(%u,%u), %u numbers:", m, k, m*k);
    ds.PutComment(szComment);
    szBuf = new char[20*D.dim_cols()];
    for(i = 0; i < D.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < D.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", D[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    // Since x0 may be em[ty due to zero initial conditions, then
    // special algorithm to save it is used.
    ds.PutComment(" Initial state x(0):");
    szBuf = new char[20*n];
    szBuf[0] = '\0';
    for(i = 0; i < n; ++i){
	NaReal fX0i = (i < x0.dim())? x0[i]: 0.0;
	sprintf(szBuf + strlen(szBuf), " %g", fX0i);
    }
    ds.PutF(NULL, "%s", szBuf);
    delete[] szBuf;
}